

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

Context_conflict * build_context(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Context_conflict *__s;
  HashTable *pHVar1;
  StringCache *pSVar2;
  ErrorList *pEVar3;
  Buffer *pBVar4;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  __s = (Context_conflict *)(*m)(0x3c0,d);
  if (__s == (Context_conflict *)0x0) {
    __s = (Context_conflict *)0x0;
  }
  else {
    if (f == (MOJOSHADER_free)0x0) {
      f = MOJOSHADER_internal_free;
    }
    memset(__s,0,0x3c0);
    __s->malloc = m;
    __s->free = f;
    __s->malloc_data = d;
    (__s->usertypes).scope = (SymbolScope *)0x0;
    pHVar1 = hash_create(__s,hash_hash_string,hash_keymatch_string,symbolmap_nuke,1,MallocBridge,
                         FreeBridge,__s);
    (__s->usertypes).hash = pHVar1;
    (__s->variables).scope = (SymbolScope *)0x0;
    pHVar1 = hash_create(__s,hash_hash_string,hash_keymatch_string,symbolmap_nuke,1,MallocBridge,
                         FreeBridge,__s);
    (__s->variables).hash = pHVar1;
    pSVar2 = stringcache_create(MallocBridge,FreeBridge,__s);
    __s->strcache = pSVar2;
    pEVar3 = errorlist_create(MallocBridge,FreeBridge,__s);
    __s->errors = pEVar3;
    pEVar3 = errorlist_create(MallocBridge,FreeBridge,__s);
    __s->warnings = pEVar3;
    pBVar4 = buffer_create(0x800,MallocBridge,FreeBridge,__s);
    __s->garbage = pBVar4;
    (__s->dt_none).type = MOJOSHADER_AST_DATATYPE_NONE;
    (__s->dt_bool).type = MOJOSHADER_AST_DATATYPE_BOOL;
    (__s->dt_int).type = MOJOSHADER_AST_DATATYPE_INT;
    (__s->dt_uint).type = MOJOSHADER_AST_DATATYPE_UINT;
    (__s->dt_float).type = MOJOSHADER_AST_DATATYPE_FLOAT;
    (__s->dt_float_snorm).type = MOJOSHADER_AST_DATATYPE_FLOAT_SNORM;
    (__s->dt_float_unorm).type = MOJOSHADER_AST_DATATYPE_FLOAT_UNORM;
    (__s->dt_half).type = MOJOSHADER_AST_DATATYPE_HALF;
    (__s->dt_double).type = MOJOSHADER_AST_DATATYPE_DOUBLE;
    (__s->dt_string).type = MOJOSHADER_AST_DATATYPE_STRING;
    (__s->dt_sampler1d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_1D;
    (__s->dt_sampler2d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_2D;
    (__s->dt_sampler3d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_3D;
    (__s->dt_samplercube).type = MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE;
    (__s->dt_samplerstate).type = MOJOSHADER_AST_DATATYPE_SAMPLER_STATE;
    (__s->dt_samplercompstate).type = MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE;
    (__s->dt_buf_bool).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_bool).array.base = &__s->dt_bool;
    (__s->dt_buf_int).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_int).array.base = &__s->dt_int;
    (__s->dt_buf_uint).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_uint).array.base = &__s->dt_uint;
    (__s->dt_buf_half).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_half).array.base = &__s->dt_half;
    (__s->dt_buf_float).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_float).array.base = &__s->dt_float;
    (__s->dt_buf_double).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_double).array.base = &__s->dt_double;
    (__s->dt_buf_float_snorm).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_float_snorm).array.base = &__s->dt_float_snorm;
    (__s->dt_buf_float_unorm).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (__s->dt_buf_float_unorm).array.base = &__s->dt_float_unorm;
  }
  return __s;
}

Assistant:

static Context *build_context(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (!m) m = MOJOSHADER_internal_malloc;
    if (!f) f = MOJOSHADER_internal_free;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    //ctx->parse_phase = MOJOSHADER_PARSEPHASE_NOTSTARTED;
    create_symbolmap(ctx, &ctx->usertypes); // !!! FIXME: check for failure.
    create_symbolmap(ctx, &ctx->variables); // !!! FIXME: check for failure.
    ctx->strcache = stringcache_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->warnings = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.

    // !!! FIXME: this feels hacky.
    ctx->garbage = buffer_create(256*sizeof(void*),MallocBridge,FreeBridge,ctx);  // !!! FIXME: check for failure.

    ctx->dt_none.type = MOJOSHADER_AST_DATATYPE_NONE;
    ctx->dt_bool.type = MOJOSHADER_AST_DATATYPE_BOOL;
    ctx->dt_int.type = MOJOSHADER_AST_DATATYPE_INT;
    ctx->dt_uint.type = MOJOSHADER_AST_DATATYPE_UINT;
    ctx->dt_float.type = MOJOSHADER_AST_DATATYPE_FLOAT;
    ctx->dt_float_snorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_SNORM;
    ctx->dt_float_unorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_UNORM;
    ctx->dt_half.type = MOJOSHADER_AST_DATATYPE_HALF;
    ctx->dt_double.type = MOJOSHADER_AST_DATATYPE_DOUBLE;
    ctx->dt_string.type = MOJOSHADER_AST_DATATYPE_STRING;
    ctx->dt_sampler1d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_1D;
    ctx->dt_sampler2d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_2D;
    ctx->dt_sampler3d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_3D;
    ctx->dt_samplercube.type = MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE;
    ctx->dt_samplerstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_STATE;
    ctx->dt_samplercompstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE;

    #define INIT_DT_BUFFER(t) \
        ctx->dt_buf_##t.type = MOJOSHADER_AST_DATATYPE_BUFFER; \
        ctx->dt_buf_##t.buffer.base = &ctx->dt_##t;
    INIT_DT_BUFFER(bool);
    INIT_DT_BUFFER(int);
    INIT_DT_BUFFER(uint);
    INIT_DT_BUFFER(half);
    INIT_DT_BUFFER(float);
    INIT_DT_BUFFER(double);
    INIT_DT_BUFFER(float_snorm);
    INIT_DT_BUFFER(float_unorm);
    #undef INIT_DT_BUFFER

    return ctx;
}